

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void MallocBlock::ProcessFreeQueue(MallocBlock *b,size_t size,int max_free_queue_size)

{
  undefined8 *puVar1;
  MallocBlock *pMVar2;
  ThreadCache *pTVar3;
  void *pvVar4;
  FreeQueue<MallocBlockQueueEntry> *pFVar5;
  SpinLock SVar6;
  long lVar7;
  ulong uVar8;
  Span *pSVar9;
  int iVar10;
  undefined8 uVar11;
  uint uVar12;
  char *pcVar13;
  MallocBlockQueueEntry *pMVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *in_FS_OFFSET;
  bool bVar18;
  MallocBlockQueueEntry local_3f8;
  undefined1 local_358 [8];
  MallocBlockQueueEntry entries [4];
  MallocBlockQueueEntry new_entry;
  
  lVar7 = 0;
  do {
    *(undefined4 *)((long)entries[0].deleter_pcs + lVar7 + 0x78) = 0;
    *(undefined8 *)(local_358 + lVar7) = 0;
    *(undefined8 *)((long)entries[0].deleter_pcs + lVar7 + -0x10) = 0;
    lVar7 = lVar7 + 0xa0;
  } while (lVar7 != 0x280);
  MallocBlockQueueEntry::MallocBlockQueueEntry
            ((MallocBlockQueueEntry *)&entries[3].deleter_threadid,b,size);
  LOCK();
  bVar18 = (__atomic_base<int>)free_queue_lock_.lockword_.super___atomic_base<int>._M_i ==
           (__atomic_base<int>)0x0;
  if (bVar18) {
    free_queue_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar18) {
    SpinLock::SlowLock(&free_queue_lock_);
  }
  if (free_queue_ == (FreeQueue<MallocBlockQueueEntry> *)0x0) {
    free_queue_ = (FreeQueue<MallocBlockQueueEntry> *)operator_new(0x28008);
    lVar7 = 0x90;
    do {
      *(undefined4 *)((long)free_queue_->q_[0].deleter_pcs + lVar7 + -0x10) = 0;
      puVar1 = (undefined8 *)((long)free_queue_ + lVar7 + -0x90);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar7 = lVar7 + 0xa0;
    } while (lVar7 != 0x28090);
    free_queue_->q_front_ = 0;
    free_queue_->q_back_ = 0;
  }
  pFVar5 = free_queue_;
  iVar10 = free_queue_->q_front_;
  uVar12 = iVar10 + 0x400;
  if (-1 < (int)(iVar10 + 1U)) {
    uVar12 = iVar10 + 1U;
  }
  if ((iVar10 - (uVar12 & 0xfffffc00)) + 1 == free_queue_->q_back_) {
    pcVar13 = "Check failed: !free_queue_->Full(): Free queue mustn\'t be full!\n";
    uVar11 = 0x40;
LAB_001190fa:
    syscall(1,2,pcVar13,uVar11);
    abort();
  }
  if (b != (MallocBlock *)0x0) {
    free_queue_size_ = free_queue_size_ + size + 0xa0;
    memcpy(free_queue_->q_ + iVar10,&entries[3].deleter_threadid,0xa0);
    iVar10 = pFVar5->q_front_;
    uVar12 = iVar10 + 0x400;
    if (-1 < (int)(iVar10 + 1U)) {
      uVar12 = iVar10 + 1U;
    }
    pFVar5->q_front_ = (iVar10 - (uVar12 & 0xfffffc00)) + 1;
  }
  do {
    pMVar14 = entries;
    lVar7 = 0;
    uVar17 = 1;
    do {
      uVar15 = uVar17;
      SVar6.lockword_.super___atomic_base<int>._M_i =
           free_queue_lock_.lockword_.super___atomic_base<int>._M_i;
      if (free_queue_size_ <= (ulong)(long)max_free_queue_size) {
        iVar10 = free_queue_->q_front_;
        uVar12 = iVar10 + 0x400;
        if (-1 < (int)(iVar10 + 1U)) {
          uVar12 = iVar10 + 1U;
        }
        if ((iVar10 - (uVar12 & 0xfffffc00)) + 1 != free_queue_->q_back_) {
          LOCK();
          free_queue_lock_.lockword_.super___atomic_base<int>._M_i =
               (atomic<int>)(__atomic_base<int>)0x0;
          UNLOCK();
          if ((__atomic_base<int>)SVar6.lockword_.super___atomic_base<int>._M_i !=
              (__atomic_base<int>)0x1) {
            SpinLock::SlowUnlock(&free_queue_lock_);
          }
          if ((uint)lVar7 == 0) {
            return;
          }
          pMVar14 = (MallocBlockQueueEntry *)local_358;
          goto LAB_00118f5e;
        }
      }
      if (3 < (uint)lVar7) {
        pcVar13 = "Check failed: num_entries < arraysize(entries): entries array overflow\n";
        uVar11 = 0x47;
        goto LAB_001190fa;
      }
      FreeQueue<MallocBlockQueueEntry>::Pop(&local_3f8,free_queue_);
      memcpy(&pMVar14[-1].deleter_threadid,&local_3f8,0xa0);
      SVar6 = free_queue_lock_;
      free_queue_size_ = (free_queue_size_ - (long)pMVar14->block) - 0xa0;
      lVar7 = lVar7 + 1;
      pMVar14 = pMVar14 + 1;
      uVar17 = uVar15 + 1;
    } while ((int)lVar7 != 4);
    LOCK();
    free_queue_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x0;
    UNLOCK();
    if ((__atomic_base<int>)SVar6.lockword_.super___atomic_base<int>._M_i != (__atomic_base<int>)0x1
       ) {
      SpinLock::SlowUnlock(&free_queue_lock_);
    }
    pMVar14 = (MallocBlockQueueEntry *)local_358;
    do {
      CheckForDanglingWrites(pMVar14);
      pMVar2 = pMVar14->block;
      pTVar3 = (ThreadCache *)*in_FS_OFFSET;
      uVar8 = (ulong)pMVar2 >> 0xd;
      uVar16 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar8 & 0xffff) * 8 + 0x10) ^
               uVar8 & 0x7ffffffff0000;
      uVar17 = uVar16;
      if (0x7f < uVar16) {
        uVar17 = size;
      }
      size = uVar17 & 0xffffffff;
      if (0x7f < uVar16) {
        if (((ulong)pMVar2 >> 0x30 == 0) &&
           (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) != 0)) {
          pSVar9 = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ +
                                       ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) +
                             (ulong)((uint)uVar8 & 0x3ffff) * 8);
        }
        else {
          pSVar9 = (Span *)0x0;
        }
        if (pSVar9 == (Span *)0x0) {
LAB_00118ed5:
          if (pMVar2 != (MallocBlock *)0x0) {
            anon_unknown.dwarf_5160::InvalidFree(pMVar2);
          }
        }
        else {
          size = (size_t)(byte)pSVar9->field_0x2a;
          if (size != 0) {
            *(ulong *)(tcmalloc::Static::pageheap_ + (uVar8 & 0xffff) * 8 + 0x10) =
                 uVar8 & 0x7ffffffff0000 | size;
            goto LAB_00118dd1;
          }
          anon_unknown.dwarf_5160::do_free_pages(pSVar9,pMVar2);
        }
      }
      else {
LAB_00118dd1:
        if (pTVar3 == (ThreadCache *)0x0) {
          if (tcmalloc::Static::inited_ == '\0') goto LAB_00118ed5;
          pMVar2->size1_ = 0;
          tcmalloc::CentralFreeList::InsertRange
                    ((CentralFreeList *)(&tcmalloc::Static::central_cache_ + size * 0x130),pMVar2,
                     pMVar2,1);
        }
        else {
          uVar12 = pTVar3->list_[size].length_ + 1;
          pvVar4 = pTVar3->list_[size].list_;
          pTVar3->list_[size].list_ = pMVar2;
          pMVar2->size1_ = (size_t)pvVar4;
          pTVar3->list_[size].length_ = uVar12;
          if (pTVar3->list_[size].max_length_ < uVar12) {
            tcmalloc::ThreadCache::ListTooLong(pTVar3,pTVar3->list_ + size,(uint32_t)size);
          }
          else {
            iVar10 = pTVar3->size_ + pTVar3->list_[size].size_;
            pTVar3->size_ = iVar10;
            if (pTVar3->max_size_ < iVar10) {
              tcmalloc::ThreadCache::Scavenge(pTVar3);
            }
          }
        }
      }
      pMVar14 = pMVar14 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    LOCK();
    bVar18 = (__atomic_base<int>)free_queue_lock_.lockword_.super___atomic_base<int>._M_i ==
             (__atomic_base<int>)0x0;
    if (bVar18) {
      free_queue_lock_.lockword_.super___atomic_base<int>._M_i =
           (atomic<int>)(__atomic_base<int>)0x1;
    }
    UNLOCK();
    if (!bVar18) {
      SpinLock::SlowLock(&free_queue_lock_);
    }
  } while( true );
LAB_00118f5e:
  CheckForDanglingWrites(pMVar14);
  pMVar2 = pMVar14->block;
  pTVar3 = (ThreadCache *)*in_FS_OFFSET;
  uVar8 = (ulong)pMVar2 >> 0xd;
  uVar16 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar8 & 0xffff) * 8 + 0x10) ^
           uVar8 & 0x7ffffffff0000;
  uVar17 = uVar16;
  if (0x7f < uVar16) {
    uVar17 = uVar15;
  }
  uVar15 = uVar17 & 0xffffffff;
  if (0x7f < uVar16) {
    if (((ulong)pMVar2 >> 0x30 == 0) &&
       (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) != 0)) {
      pSVar9 = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ +
                                   ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) +
                         (ulong)((uint)uVar8 & 0x3ffff) * 8);
    }
    else {
      pSVar9 = (Span *)0x0;
    }
    if (pSVar9 == (Span *)0x0) {
LAB_001190b4:
      if (pMVar2 != (MallocBlock *)0x0) {
        anon_unknown.dwarf_5160::InvalidFree(pMVar2);
      }
    }
    else {
      uVar15 = (ulong)(byte)pSVar9->field_0x2a;
      if (uVar15 != 0) {
        *(ulong *)(tcmalloc::Static::pageheap_ + (uVar8 & 0xffff) * 8 + 0x10) =
             uVar8 & 0x7ffffffff0000 | uVar15;
        goto LAB_00118fb0;
      }
      anon_unknown.dwarf_5160::do_free_pages(pSVar9,pMVar2);
    }
  }
  else {
LAB_00118fb0:
    if (pTVar3 == (ThreadCache *)0x0) {
      if (tcmalloc::Static::inited_ == '\0') goto LAB_001190b4;
      pMVar2->size1_ = 0;
      tcmalloc::CentralFreeList::InsertRange
                ((CentralFreeList *)(&tcmalloc::Static::central_cache_ + uVar15 * 0x130),pMVar2,
                 pMVar2,1);
    }
    else {
      uVar12 = pTVar3->list_[uVar15].length_ + 1;
      pvVar4 = pTVar3->list_[uVar15].list_;
      pTVar3->list_[uVar15].list_ = pMVar2;
      pMVar2->size1_ = (size_t)pvVar4;
      pTVar3->list_[uVar15].length_ = uVar12;
      if (pTVar3->list_[uVar15].max_length_ < uVar12) {
        tcmalloc::ThreadCache::ListTooLong(pTVar3,pTVar3->list_ + uVar15,(uint32_t)uVar15);
      }
      else {
        iVar10 = pTVar3->size_ + pTVar3->list_[uVar15].size_;
        pTVar3->size_ = iVar10;
        if (pTVar3->max_size_ < iVar10) {
          tcmalloc::ThreadCache::Scavenge(pTVar3);
        }
      }
    }
  }
  pMVar14 = pMVar14 + 1;
  lVar7 = lVar7 + -1;
  if (lVar7 == 0) {
    return;
  }
  goto LAB_00118f5e;
}

Assistant:

static void ProcessFreeQueue(MallocBlock* b, size_t size,
                               int max_free_queue_size) {
    // MallocBlockQueueEntry are about 144 in size, so we can only
    // use a small array of them on the stack.
    MallocBlockQueueEntry entries[4];
    int num_entries = 0;
    MallocBlockQueueEntry new_entry(b, size);
    free_queue_lock_.Lock();
    if (free_queue_ == nullptr)
      free_queue_ = new FreeQueue<MallocBlockQueueEntry>;
    RAW_CHECK(!free_queue_->Full(), "Free queue mustn't be full!");

    if (b != nullptr) {
      free_queue_size_ += size + sizeof(MallocBlockQueueEntry);
      free_queue_->Push(new_entry);
    }

    // Free blocks until the total size of unfreed blocks no longer exceeds
    // max_free_queue_size, and the free queue has at least one free
    // space in it.
    while (free_queue_size_ > max_free_queue_size || free_queue_->Full()) {
      RAW_CHECK(num_entries < arraysize(entries), "entries array overflow");
      entries[num_entries] = free_queue_->Pop();
      free_queue_size_ -=
          entries[num_entries].size + sizeof(MallocBlockQueueEntry);
      num_entries++;
      if (num_entries == arraysize(entries)) {
        // The queue will not be full at this point, so it is ok to
        // release the lock.  The queue may still contain more than
        // max_free_queue_size, but this is not a strict invariant.
        free_queue_lock_.Unlock();
        for (int i = 0; i < num_entries; i++) {
          CheckForDanglingWrites(entries[i]);
          do_free(entries[i].block);
        }
        num_entries = 0;
        free_queue_lock_.Lock();
      }
    }
    free_queue_lock_.Unlock();
    for (int i = 0; i < num_entries; i++) {
      CheckForDanglingWrites(entries[i]);
      do_free(entries[i].block);
    }
  }